

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O3

void __thiscall
HtmlModelSerialiser::HtmlModelSerialiser
          (HtmlModelSerialiser *this,QAbstractItemModel *model,QObject *parent)

{
  AbstractStringSerialiserPrivate *this_00;
  
  *(undefined ***)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser =
       &PTR_metaObject_00165e28;
  this_00 = (AbstractStringSerialiserPrivate *)operator_new(0x40);
  AbstractStringSerialiserPrivate::AbstractStringSerialiserPrivate
            (this_00,&this->super_AbstractStringSerialiser);
  *(undefined1 *)&this_00[1].super_AbstractModelSerialiserPrivate.m_streamVersion = Qt_1_0;
  AbstractStringSerialiser::AbstractStringSerialiser
            (&this->super_AbstractStringSerialiser,this_00,parent);
  *(undefined ***)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser =
       &PTR_metaObject_00165e28;
  AbstractModelSerialiser::setModel((AbstractModelSerialiser *)this,model);
  return;
}

Assistant:

HtmlModelSerialiser::HtmlModelSerialiser(const QAbstractItemModel *model, QObject *parent)
    : AbstractStringSerialiser(*new HtmlModelSerialiserPrivate(this), parent)
{
    setModel(model);
}